

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

int asm_isk32(ASMState *as,IRRef ref,int32_t *k)

{
  IRIns *pIVar1;
  IRIns IVar2;
  ulong uVar3;
  
  if (0x7fff < ref) {
    return 0;
  }
  pIVar1 = as->ir;
  uVar3 = (ulong)ref;
  if (*(char *)((long)pIVar1 + uVar3 * 8 + 5) == '\x1d') {
    IVar2 = pIVar1[uVar3 + 1];
    if ((IRIns)(long)IVar2.i != IVar2) {
      return 0;
    }
  }
  else {
    IVar2._4_4_ = 0;
    IVar2.field_1.op12 = pIVar1[uVar3].field_1.op12;
  }
  *k = IVar2.i;
  return 1;
}

Assistant:

static int asm_isk32(ASMState *as, IRRef ref, int32_t *k)
{
  if (irref_isk(ref)) {
    IRIns *ir = IR(ref);
#if LJ_GC64
    if (ir->o == IR_KNULL || !irt_is64(ir->t)) {
      *k = ir->i;
      return 1;
    } else if (checki32((int64_t)ir_k64(ir)->u64)) {
      *k = (int32_t)ir_k64(ir)->u64;
      return 1;
    }
#else
    if (ir->o != IR_KINT64) {
      *k = ir->i;
      return 1;
    } else if (checki32((int64_t)ir_kint64(ir)->u64)) {
      *k = (int32_t)ir_kint64(ir)->u64;
      return 1;
    }
#endif
  }
  return 0;
}